

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O1

void senjo::BackgroundCommand::Run(void *data)

{
  Output local_20;
  
  if (data == (void *)0x0) {
    Output::Output(&local_20,InfoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"BackgroundCommand::Run() NULL data parameter",0x2c);
    Output::~Output(&local_20);
  }
  else {
    (**(code **)(*data + 0x30))();
    if (data != (void *)0x0) {
      (**(code **)(*data + 8))(data);
    }
  }
  return;
}

Assistant:

void BackgroundCommand::Run(void* data)
{
  BackgroundCommand* cmd = NULL;
  try {
    if (!data) {
      Output() << "BackgroundCommand::Run() NULL data parameter";
      return;
    }

#ifdef NDEBUG
    cmd = static_cast<BackgroundCommand*>(data);
#else
    cmd = reinterpret_cast<BackgroundCommand*>(data);
    if (!cmd) {
      // NOTE: potential memory leak if this happens
      Output() << "BackgroundCommand::Run() failed to cast data parameter";
      return;
    }
#endif

    cmd->Execute();
  }
  catch (const std::exception& e) {
    std::cerr << "BackgrounThread::Run() ERROR: "
              << e.what() << std::endl;
  }
  catch (...) {
    std::cerr << "BackgrounThread::Run() ERROR: unknown exception"
              << std::endl;
  }

  if (cmd) {
    delete cmd;
    cmd = NULL;
  }
}